

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall ast::FunctionLiteral::~FunctionLiteral(FunctionLiteral *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  (this->super_Expr).super_Node._vptr_Node = (_func_int **)&PTR__FunctionLiteral_00122728;
  if (this->header != (Identifier *)0x0) {
    (*(this->header->super_Expr).super_Node._vptr_Node[1])();
  }
  this->header = (Identifier *)0x0;
  ppIVar1 = (this->parameters).
            super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppIVar2 = (this->parameters).
                 super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppIVar2 != ppIVar1; ppIVar2 = ppIVar2 + 1) {
    if (*ppIVar2 != (Identifier *)0x0) {
      (*((*ppIVar2)->super_Expr).super_Node._vptr_Node[1])();
    }
  }
  ppIVar2 = (this->parameters).
            super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->parameters).super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppIVar2) {
    (this->parameters).super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppIVar2;
  }
  if (this->body != (BlockStmt *)0x0) {
    (*(this->body->super_Stmt).super_Node._vptr_Node[1])();
  }
  this->body = (BlockStmt *)0x0;
  std::_Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::~_Vector_base
            (&(this->parameters).
              super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>);
  token::Token::~Token(&this->tok);
  return;
}

Assistant:

~FunctionLiteral(){
        delete  header;
        header = nullptr;
        for(auto param: parameters){
            delete  param;
            param = nullptr;
        }
        parameters.clear();
        delete body;
        body = nullptr;
    }